

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TestCaseFilter::TestCaseFilter(TestCaseFilter *this,string *testSpec,DoWhat matchBehaviour)

{
  pointer pcVar1;
  size_type sVar2;
  undefined1 *puVar3;
  int iVar4;
  DoWhat DVar5;
  string *lc;
  size_type sVar6;
  bool bVar7;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  (this->m_stringToMatch)._M_dataplus._M_p = (pointer)&(this->m_stringToMatch).field_2;
  pcVar1 = (testSpec->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + testSpec->_M_string_length);
  sVar2 = (this->m_stringToMatch)._M_string_length;
  if (sVar2 != 0) {
    pcVar1 = (this->m_stringToMatch)._M_dataplus._M_p;
    sVar6 = 0;
    do {
      iVar4 = tolower((int)pcVar1[sVar6]);
      pcVar1[sVar6] = (char)iVar4;
      sVar6 = sVar6 + 1;
    } while (sVar2 != sVar6);
  }
  this->m_filterType = matchBehaviour;
  this->m_wildcardPosition = NoWildcard;
  if (matchBehaviour != AutoDetectBehaviour) goto LAB_0013eb10;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"exclude:","");
  if ((this->m_stringToMatch)._M_string_length < local_48) {
    bVar7 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
    puVar3 = local_70;
    if (local_68 == local_48) {
      if (local_68 == 0) {
        bVar7 = true;
      }
      else {
        iVar4 = bcmp(local_70,local_50,local_68);
        bVar7 = iVar4 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if (puVar3 != local_60) {
      operator_delete(puVar3);
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (bVar7) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
LAB_0013eae6:
    std::__cxx11::string::operator=((string *)this,(string *)&local_70);
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    DVar5 = ExcludeTests;
  }
  else {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"~","");
    if ((this->m_stringToMatch)._M_string_length < local_48) {
      bVar7 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
      puVar3 = local_70;
      if (local_68 == local_48) {
        if (local_68 == 0) {
          bVar7 = true;
        }
        else {
          iVar4 = bcmp(local_70,local_50,local_68);
          bVar7 = iVar4 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if (puVar3 != local_60) {
        operator_delete(puVar3);
      }
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    DVar5 = IncludeTests;
    if (bVar7) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
      goto LAB_0013eae6;
    }
  }
  this->m_filterType = DVar5;
LAB_0013eb10:
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"*","");
  if ((this->m_stringToMatch)._M_string_length < local_48) {
    bVar7 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
    puVar3 = local_70;
    if (local_68 == local_48) {
      if (local_68 == 0) {
        bVar7 = true;
      }
      else {
        iVar4 = bcmp(local_70,local_50,local_68);
        bVar7 = iVar4 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if (puVar3 != local_60) {
      operator_delete(puVar3);
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (bVar7) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
    std::__cxx11::string::operator=((string *)this,(string *)&local_70);
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    *(undefined1 *)&this->m_wildcardPosition = (char)this->m_wildcardPosition | WildcardAtStart;
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"*","");
  if ((this->m_stringToMatch)._M_string_length < local_48) {
    bVar7 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
    puVar3 = local_70;
    if (local_68 == local_48) {
      if (local_68 == 0) {
        bVar7 = true;
      }
      else {
        iVar4 = bcmp(local_70,local_50,local_68);
        bVar7 = iVar4 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if (puVar3 != local_60) {
      operator_delete(puVar3);
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (bVar7) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
    std::__cxx11::string::operator=((string *)this,(string *)&local_70);
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    *(undefined1 *)&this->m_wildcardPosition = (char)this->m_wildcardPosition | WildcardAtEnd;
  }
  return;
}

Assistant:

TestCaseFilter( std::string const& testSpec, IfFilterMatches::DoWhat matchBehaviour = IfFilterMatches::AutoDetectBehaviour )
        :   m_stringToMatch( toLower( testSpec ) ),
            m_filterType( matchBehaviour ),
            m_wildcardPosition( NoWildcard )
        {
            if( m_filterType == IfFilterMatches::AutoDetectBehaviour ) {
                if( startsWith( m_stringToMatch, "exclude:" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 8 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else if( startsWith( m_stringToMatch, "~" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 1 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else {
                    m_filterType = IfFilterMatches::IncludeTests;
                }
            }

            if( startsWith( m_stringToMatch, "*" ) ) {
                m_stringToMatch = m_stringToMatch.substr( 1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtStart );
            }
            if( endsWith( m_stringToMatch, "*" ) ) {
                m_stringToMatch = m_stringToMatch.substr( 0, m_stringToMatch.size()-1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtEnd );
            }
        }